

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

uchar * mcmlck(mcmcxdef *ctx,mcmon objnum)

{
  errcxdef *ctx_00;
  ushort in_SI;
  undefined8 *in_RDI;
  mcmodef *o;
  mcmon in_stack_0000013e;
  mcmcxdef *in_stack_00000140;
  char *in_stack_ffffffffffffffd8;
  errdef *local_8;
  
  ctx_00 = (errcxdef *)
           (*(long *)(*(long *)*in_RDI +
                     (long)((int)(uint)*(ushort *)
                                        (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                        (long)(int)(in_SI & 0xff) * 2) >> 8) * 8) +
           (long)(int)(*(ushort *)
                        (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] + (long)(int)(in_SI & 0xff) * 2)
                      & 0xff) * 0x20);
  if ((((ulong)ctx_00->errcxlgc & 0x8000000000) == 0) &&
     (*(short *)(in_RDI[(long)((int)(uint)in_SI >> 8) + 6] + (long)(int)(in_SI & 0xff) * 2) != -1))
  {
    if (((ulong)ctx_00->errcxlgc & 0x800000000) == 0) {
      local_8 = (errdef *)mcmload(in_stack_00000140,in_stack_0000013e);
    }
    else {
      *(ushort *)((long)&ctx_00->errcxlgc + 4) = *(ushort *)((long)&ctx_00->errcxlgc + 4) | 4;
      *(char *)((long)&ctx_00->errcxlgc + 6) = *(char *)((long)&ctx_00->errcxlgc + 6) + '\x01';
      local_8 = ctx_00->errcxptr;
    }
    return (uchar *)local_8;
  }
  errsigf(ctx_00,in_stack_ffffffffffffffd8,0);
}

Assistant:

uchar *mcmlck(mcmcxdef *ctx, mcmon objnum)
{
    mcmodef *o = mcmobje(ctx, objnum);

    if ((o->mcmoflg & MCMOFFREE) != 0 || mcmc2g(ctx, objnum) == MCMONINV)
    {
        errsig(ctx->mcmcxgl->mcmcxerr, ERR_INVOBJ);
        return 0;
    }
    else if (o->mcmoflg & MCMOFPRES)
    {
        o->mcmoflg |= MCMOFLOCK;
        ++(o->mcmolcnt);
        return(o->mcmoptr);
    }
    else
        return(mcmload(ctx, objnum));
}